

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_7::TwoLevelIterator::status(TwoLevelIterator *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  long *plVar2;
  void *local_20;
  
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x50))(&local_20);
  if (local_20 == (void *)0x0) {
    if (*(long **)(in_RSI + 0x78) != (long *)0x0) {
      (**(code **)(**(long **)(in_RSI + 0x78) + 0x50))(&local_20);
      if (local_20 != (void *)0x0) {
        operator_delete__(local_20);
        plVar2 = *(long **)(in_RSI + 0x78);
        goto LAB_00108c0c;
      }
    }
    if (*(char **)(in_RSI + 0x50) == (char *)0x0) {
      pp_Var1 = (_func_int **)0x0;
    }
    else {
      pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x50));
    }
    (this->super_Iterator)._vptr_Iterator = pp_Var1;
  }
  else {
    operator_delete__(local_20);
    plVar2 = *(long **)(in_RSI + 0x58);
LAB_00108c0c:
    (**(code **)(*plVar2 + 0x50))(this);
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }